

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

uchar * __thiscall CVmRun::compute_diff_sub(CVmRun *this,uchar *p)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  int iVar3;
  vm_val_t val;
  vm_val_t local_28;
  
  iVar3 = compute_diff(this,sp_ + -2,sp_ + -1);
  if (iVar3 == 0) {
    local_28.typ = sp_[-2].typ;
    local_28._4_4_ = *(undefined4 *)&sp_[-2].field_0x4;
    local_28.val = sp_[-2].val;
    uVar2 = *(undefined4 *)&sp_[-1].field_0x4;
    aVar1 = sp_[-1].val;
    sp_[-2].typ = sp_[-1].typ;
    *(undefined4 *)&sp_[-2].field_0x4 = uVar2;
    sp_[-2].val = aVar1;
    sp_ = sp_ + -1;
    p = op_overload(this,(int)p - (int)entry_ptr_native_,-1,&local_28,G_predef_X.operator_sub,1,
                    0x7d7);
  }
  else {
    sp_ = sp_ + -1;
  }
  return p;
}

Assistant:

const uchar *CVmRun::compute_diff_sub(VMG_ const uchar *p)
{
    if (compute_diff(vmg_ get(1), get(0)))
    {
        /* the difference is at TOS-1 - discard the second value */
        discard();
        return p;
    }
    else
    {
        /* try for an operator overload */
        vm_val_t val;
        pop_left_op(vmg_ &val);
        return op_overload(vmg_ p - entry_ptr_native_, -1,
                           &val, G_predef->operator_sub, 1,
                           VMERR_BAD_TYPE_SUB);
    }
}